

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall
QItemSelectionModel::rowIntersectsSelection(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  parameter_type pQVar5;
  QAbstractItemModel *pQVar6;
  arrow_operator_result ppQVar7;
  undefined8 in_RDX;
  uint in_ESI;
  long in_FS_OFFSET;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_0000003c;
  int j;
  int right;
  int left;
  int bottom;
  int top;
  QItemSelectionRange *range;
  add_const_t<QItemSelection> *__range1;
  QItemSelectionModelPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QItemSelection sel;
  undefined4 in_stack_fffffffffffffed8;
  QFlagsStorage<Qt::ItemFlag> in_stack_fffffffffffffedc;
  QModelIndex *in_stack_fffffffffffffee0;
  bool local_e9;
  uint local_d4;
  bool local_79;
  undefined1 local_78 [24];
  QItemSelectionRange *local_60;
  const_iterator local_58;
  const_iterator local_50;
  QItemSelection *in_stack_ffffffffffffffb8;
  QItemSelection *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QItemSelectionModel *)0x82ebc0);
  pQVar5 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                    *)in_stack_fffffffffffffee0);
  if (pQVar5 == (parameter_type)0x0) {
    local_79 = false;
  }
  else {
    bVar2 = QModelIndex::isValid(in_stack_fffffffffffffee0);
    if (bVar2) {
      pQVar5 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                         ((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                           *)0x82ec10);
      pQVar6 = QModelIndex::model((QModelIndex *)0x82ec22);
      if (pQVar5 != pQVar6) {
        local_79 = false;
        goto LAB_0082ef73;
      }
    }
    QItemSelection::QItemSelection
              ((QItemSelection *)in_stack_fffffffffffffee0,
               (QItemSelection *)CONCAT44(in_stack_fffffffffffffedc.i,in_stack_fffffffffffffed8));
    QItemSelection::merge
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (SelectionFlags)in_stack_0000003c.i);
    bVar2 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82ecba);
    local_e9 = true;
    if (!bVar2) {
      QList<QItemSelectionRange>::constFirst
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0);
      QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffffee0);
      local_e9 = ::operator!=(in_stack_fffffffffffffee0,
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffedc.i,in_stack_fffffffffffffed8));
    }
    if (local_e9 == false) {
      local_50.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_50 = QList<QItemSelectionRange>::begin
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0);
      local_58.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = QList<QItemSelectionRange>::end
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffee0);
      while( true ) {
        local_60 = local_58.i;
        bVar2 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_50,local_58);
        if (!bVar2) break;
        QList<QItemSelectionRange>::const_iterator::operator*(&local_50);
        iVar3 = QItemSelectionRange::top((QItemSelectionRange *)0x82ee12);
        iVar4 = QItemSelectionRange::bottom((QItemSelectionRange *)0x82ee2a);
        if ((iVar3 <= (int)in_ESI) && ((int)in_ESI <= iVar4)) {
          local_d4 = QItemSelectionRange::left((QItemSelectionRange *)0x82ee64);
          iVar3 = QItemSelectionRange::right((QItemSelectionRange *)0x82ee7c);
          for (; (int)local_d4 <= iVar3; local_d4 = local_d4 + 1) {
            ppQVar7 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                      ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                    *)in_stack_fffffffffffffee0);
            (*((*ppQVar7)->super_QObject)._vptr_QObject[0xc])
                      (local_78,*ppQVar7,(ulong)in_ESI,(ulong)local_d4,in_RDX);
            QModelIndex::flags(in_stack_fffffffffffffee0);
            bVar2 = isSelectableAndEnabled((ItemFlags)in_stack_fffffffffffffedc.i);
            if (bVar2) {
              local_79 = true;
              goto LAB_0082ef66;
            }
          }
        }
        QList<QItemSelectionRange>::const_iterator::operator++(&local_50);
      }
      local_79 = false;
    }
    else {
      local_79 = false;
    }
LAB_0082ef66:
    QItemSelection::~QItemSelection((QItemSelection *)0x82ef73);
  }
LAB_0082ef73:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

bool QItemSelectionModel::rowIntersectsSelection(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
         return false;

    QItemSelection sel = d->ranges;
    sel.merge(d->currentSelection, d->currentCommand);
    if (sel.isEmpty() || sel.constFirst().parent() != parent)
        return false;

    for (const QItemSelectionRange &range : std::as_const(sel)) {
        int top = range.top();
        int bottom = range.bottom();
        if (top <= row && bottom >= row) {
            int left = range.left();
            int right = range.right();
            for (int j = left; j <= right; j++) {
                if (isSelectableAndEnabled(d->model->index(row, j, parent).flags()))
                    return true;
            }
        }
    }

    return false;
}